

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

size_t rtosc_vmessage(char *buffer,size_t len,char *address,char *arguments,__va_list_tag *ap)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  char *unaff_RBP;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  undefined8 auStack_80 [2];
  char *in_stack_ffffffffffffff90;
  rtosc_va_list_t ap2;
  unsigned_long __vla_expr0;
  uint nargs;
  __va_list_tag *ap_local;
  char *arguments_local;
  char *address_local;
  size_t len_local;
  char *buffer_local;
  
  auStack_80[0] = 0x102695;
  len_local = (size_t)buffer;
  uVar2 = nreserved(in_stack_ffffffffffffff90);
  if (uVar2 == 0) {
    auStack_80[0] = 0x1026b8;
    buffer_local = (char *)rtosc_amessage(in_stack_00000008,unaff_retaddr,unaff_RBP,buffer_local,
                                          (rtosc_arg_t *)len_local);
  }
  else {
    uVar3 = (ulong)uVar2;
    lVar1 = uVar3 * -0x10;
    auStack_80[uVar3 * -2] = 0x102708;
    rtosc_v2args(*(rtosc_arg_t **)(&stack0x00000000 + lVar1),
                 *(size_t *)(&stack0xfffffffffffffff8 + lVar1),(&buffer_local)[uVar3 * -2],
                 (rtosc_va_list_t *)(&len_local)[uVar3 * -2]);
    auStack_80[uVar3 * -2] = 0x102721;
    buffer_local = (char *)rtosc_amessage((&stack0x00000008)[uVar3 * -2],
                                          *(size_t *)(&stack0x00000000 + lVar1),
                                          *(char **)(&stack0xfffffffffffffff8 + lVar1),
                                          (&buffer_local)[uVar3 * -2],
                                          (rtosc_arg_t *)(&len_local)[uVar3 * -2]);
  }
  return (size_t)buffer_local;
}

Assistant:

size_t rtosc_vmessage(char       *buffer,
                      size_t      len,
                      const char *address,
                      const char *arguments,
                      va_list     ap)
{
    const unsigned nargs = nreserved(arguments);
    if(!nargs)
        return rtosc_amessage(buffer,len,address,arguments,NULL);

    STACKALLOC(rtosc_arg_t, args, nargs);
    rtosc_va_list_t ap2;
    va_copy(ap2.a, ap);
    rtosc_v2args(args, nargs, arguments, &ap2);

    return rtosc_amessage(buffer,len,address,arguments,args);
}